

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::WritePool(WalletBatch *this,int64_t nPool,CKeyPool *keypool)

{
  byte bVar1;
  undefined8 in_RDI;
  undefined1 fOverwrite;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  CKeyPool *value;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  WalletBatch *in_stack_ffffffffffffffb0;
  long local_8;
  
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  value = (CKeyPool *)&stack0xffffffffffffffd0;
  std::make_pair<std::__cxx11::string_const&,long&>
            (in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,long>,wallet::CKeyPool>
                    (in_stack_ffffffffffffffb0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                      *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),value,
                     (bool)fOverwrite);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
  ~pair(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WritePool(int64_t nPool, const CKeyPool& keypool)
{
    return WriteIC(std::make_pair(DBKeys::POOL, nPool), keypool);
}